

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O2

uint32 key2hash(hash_table_t *h,char *key)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  byte bVar6;
  
  if (h->nocase == 0) {
    iVar4 = 0;
    uVar3 = 0;
    for (; *key != 0; key = key + 1) {
      uVar3 = uVar3 + ((int)*key << ((byte)iVar4 & 0x1f));
      iVar5 = iVar4 + 5;
      bVar2 = iVar4 < 0x14;
      iVar4 = iVar4 + -0x13;
      if (bVar2) {
        iVar4 = iVar5;
      }
    }
  }
  else {
    iVar4 = 0;
    uVar3 = 0;
    for (; bVar1 = *key, bVar1 != 0; key = (char *)((byte *)key + 1)) {
      bVar6 = bVar1 - 0x20;
      if (0x19 < (byte)(bVar1 + 0x9f)) {
        bVar6 = bVar1;
      }
      uVar3 = uVar3 + ((uint)bVar6 << ((byte)iVar4 & 0x1f));
      iVar5 = iVar4 + 5;
      bVar2 = iVar4 < 0x14;
      iVar4 = iVar4 + -0x13;
      if (bVar2) {
        iVar4 = iVar5;
      }
    }
  }
  return uVar3 % (uint)h->size;
}

Assistant:

static uint32
key2hash(hash_table_t * h, const char *key)
{

    register const char *cp;

    /* This is a hack because the best way to solve it is to make sure 
       all character representation is unsigned character in the first place.        
       (or better unicode.) */
    register unsigned char c;
    register int32 s;
    register uint32 hash;

    hash = 0;
    s = 0;

    if (h->nocase) {
        for (cp = key; *cp; cp++) {
            c = *cp;
            c = UPPER_CASE(c);
            hash += c << s;
            s += 5;
            if (s >= 25)
                s -= 24;
        }
    }
    else {
        for (cp = key; *cp; cp++) {
            hash += (*cp) << s;
            s += 5;
            if (s >= 25)
                s -= 24;
        }
    }

    return (hash % h->size);
}